

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

bool tcu::boolAll<3>(Vector<bool,_3> *a)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 3) break;
    uVar1 = uVar2 + 1;
  } while (a->m_data[uVar2] != false);
  return 2 < uVar2;
}

Assistant:

inline bool boolAll (const Vector<bool, Size>& a)
{
	for (int i = 0; i < Size; i++)
		if (a.m_data[i] == false)
			return false;
	return true;
}